

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

bool __thiscall FSlide::BounceTraverse(FSlide *this,DVector2 *start,DVector2 *end)

{
  line_t *linedef;
  AActor *actor;
  undefined8 uVar1;
  int iVar2;
  double dVar3;
  undefined1 local_150 [40];
  TVector2<double> local_128;
  line_t *local_118;
  line_t *li;
  intercept_t *local_100;
  intercept_t *in;
  FPathTraverse it;
  FLineOpening open;
  DVector2 *end_local;
  DVector2 *start_local;
  FSlide *this_local;
  
  FLineOpening::FLineOpening((FLineOpening *)&it.count);
  FPathTraverse::FPathTraverse((FPathTraverse *)&in,start->X,start->Y,end->X,end->Y,1,0.0);
  do {
    while( true ) {
      while( true ) {
        local_100 = FPathTraverse::Next((FPathTraverse *)&in);
        if (local_100 == (intercept_t *)0x0) {
          this_local._7_1_ = true;
          goto LAB_006769c4;
        }
        if ((local_100->isaline & 1U) != 0) break;
        Printf("PTR_BounceTraverse: not a line?");
      }
      linedef = (local_100->d).line;
      local_118 = linedef;
      if ((ulong)((long)linedef - (long)lines) % 0x98 != 0) {
        __assert_fail("((size_t)li - (size_t)lines) % sizeof(line_t) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_map.cpp"
                      ,0xc40,"bool FSlide::BounceTraverse(const DVector2 &, const DVector2 &)");
      }
      if ((linedef->flags & 0x8000) != 0) goto LAB_00676958;
      if (((linedef->flags & 4) == 0) || (linedef->backsector == (sector_t *)0x0)) break;
      actor = this->slidemo;
      FPathTraverse::InterceptPoint((FPathTraverse *)local_150,(intercept_t *)&in);
      P_LineOpening((FLineOpening *)&it.count,actor,linedef,(DVector2 *)local_150,(DVector2 *)0x0,0)
      ;
      uVar1 = it._56_8_;
      if (((open.bottom < this->slidemo->Height) ||
          (dVar3 = AActor::Top(this->slidemo), (double)uVar1 < dVar3)) ||
         (dVar3 = AActor::Z(this->slidemo), dVar3 < open.top)) goto LAB_00676958;
    }
    AActor::Pos((DVector3 *)(local_150 + 0x10),this->slidemo);
    TVector2<double>::TVector2(&local_128,(TVector3<double> *)(local_150 + 0x10));
    iVar2 = P_PointOnLineSide(&local_128,local_118);
  } while (iVar2 != 0);
LAB_00676958:
  if (local_100->frac < this->bestSlidefrac) {
    this->secondSlidefrac = this->bestSlidefrac;
    this->secondslideline = this->bestslideline;
    this->bestSlidefrac = local_100->frac;
    this->bestslideline = local_118;
  }
  this_local._7_1_ = false;
LAB_006769c4:
  FPathTraverse::~FPathTraverse((FPathTraverse *)&in);
  return this_local._7_1_;
}

Assistant:

bool FSlide::BounceTraverse(const DVector2 &start, const DVector2 &end)
{
	FLineOpening open;
	FPathTraverse it(start.X, start.Y, end.X, end.Y, PT_ADDLINES);
	intercept_t *in;

	while ((in = it.Next()))
	{

		line_t  *li;

		if (!in->isaline)
		{
			Printf("PTR_BounceTraverse: not a line?");
			continue;
		}

		li = in->d.line;
		assert(((size_t)li - (size_t)lines) % sizeof(line_t) == 0);
		if (li->flags & ML_BLOCKEVERYTHING)
		{
			goto bounceblocking;
		}
		if (!(li->flags&ML_TWOSIDED) || !li->backsector)
		{
			if (P_PointOnLineSide(slidemo->Pos(), li))
				continue;			// don't hit the back side
			goto bounceblocking;
		}


		P_LineOpening(open, slidemo, li, it.InterceptPoint(in));	// set openrange, opentop, openbottom
		if (open.range < slidemo->Height)
			goto bounceblocking;				// doesn't fit

		if (open.top < slidemo->Top())
			goto bounceblocking;				// mobj is too high

		if (open.bottom > slidemo->Z())
			goto bounceblocking;				// mobj is too low

		continue;			// this line doesn't block movement

		// the line does block movement, see if it is closer than best so far
	bounceblocking:
		if (in->frac < bestSlidefrac)
		{
			secondSlidefrac = bestSlidefrac;
			secondslideline = bestslideline;
			bestSlidefrac = in->frac;
			bestslideline = li;
		}
		return false;   // stop
	}
	return true;
}